

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztransfer.cpp
# Opt level: O1

void __thiscall
TPZTransfer<std::complex<double>_>::MultAdd
          (TPZTransfer<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *x,
          TPZFMatrix<std::complex<double>_> *y,TPZFMatrix<std::complex<double>_> *z,
          complex<double> alpha,complex<double> beta,int opt)

{
  long lVar1;
  complex<double> beta_00;
  int iVar2;
  ulong uVar3;
  complex<double> *pcVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  ulong uVar16;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  complex<double> alpha_00;
  complex<double> alpha_01;
  complex<double> beta_01;
  TPZFMatrix<std::complex<double>_> tempcoarse;
  TPZFMatrix<std::complex<double>_> tempfine;
  undefined8 in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdf8;
  TPZFMatrix<std::complex<double>_> local_150;
  TPZFMatrix<std::complex<double>_> local_c0;
  
  uVar14 = alpha._M_value._8_8_;
  uVar13 = alpha._M_value._0_8_;
  alpha_00._M_value._0_4_ = alpha._M_value._0_4_;
  if (alpha_00._M_value._0_4_ == 0) {
    lVar5 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  }
  else {
    lVar5 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  }
  if (lVar5 != (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow) {
    TPZMatrix<std::complex<double>_>::Error
              ("TPZTransfer<TVar>::MultAdd <matrices with incompatible dimensions>",(char *)0x0);
  }
  lVar5 = (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  if ((lVar5 != (y->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol) ||
     (lVar5 != (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol)) {
    TPZMatrix<std::complex<double>_>::Error
              ("TPZTransfer<TVar>::MultiplyAdd incompatible dimensions\n",(char *)0x0);
  }
  beta_01._M_value._4_4_ = 0;
  beta_01._M_value._0_4_ = alpha_00._M_value._0_4_;
  beta_01._M_value._8_8_ = uVar13;
  TPZMatrix<std::complex<double>_>::PrepareZ
            (&this->super_TPZMatrix<std::complex<double>_>,y,z,beta_01,(int)uVar14);
  lVar5 = (long)*(int *)&(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                         field_0x1c;
  if (lVar5 == 1) {
    alpha_00._M_value._4_4_ = 0;
    alpha_00._M_value._8_8_ = uVar14;
    MultAddScalar(this,x,y,z,alpha_00,beta,opt);
    return;
  }
  uVar3 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow / lVar5;
  if (0 < *(int *)&(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.field_0x1c) {
    uVar12 = (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
    lVar5 = (long)(int)((this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol /
                       lVar5);
    iVar11 = (int)uVar12;
    lVar6 = (long)iVar11;
    uVar7 = lVar5 * lVar6;
    iVar10 = (int)uVar3;
    uVar8 = iVar10 * lVar6;
    uVar3 = uVar3 & 0x7fffffff;
    uVar12 = uVar12 & 0x7fffffff;
    iVar15 = 0;
    do {
      local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01841760;
      local_150.fSize = 0;
      local_150.fElem = (complex<double> *)0x0;
      local_150.fGiven = (complex<double> *)0x0;
      local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = lVar5;
      local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol = lVar6;
      TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
      local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
      local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
      local_150.fPivot.super_TPZVec<int>.fNElements = 0;
      local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01840c80;
      local_150.fWork.fNAlloc = 0;
      local_150.fWork.fStore = (complex<double> *)0x0;
      local_150.fWork.fNElements = 0;
      if (uVar7 != 0) {
        pcVar4 = (complex<double> *)operator_new__(-(ulong)(uVar7 >> 0x3c != 0) | uVar7 * 0x10);
        memset(pcVar4,0,uVar7 * 0x10);
        local_150.fElem = pcVar4;
      }
      local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01841760;
      local_c0.fElem = (complex<double> *)0x0;
      local_c0.fGiven = (complex<double> *)0x0;
      local_c0.fSize = 0;
      local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = (long)iVar10;
      local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol = lVar6;
      TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
      local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
      local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
      local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
      local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01840c80;
      local_c0.fWork.fStore = (complex<double> *)0x0;
      local_c0.fWork.fNElements = 0;
      local_c0.fWork.fNAlloc = 0;
      if (uVar8 != 0) {
        pcVar4 = (complex<double> *)operator_new__(-(ulong)(uVar8 >> 0x3c != 0) | uVar8 * 0x10);
        memset(pcVar4,0,uVar8 * 0x10);
        local_c0.fElem = pcVar4;
      }
      if (0 < iVar10) {
        uVar16 = 0;
        do {
          if (0 < iVar11) {
            uVar9 = 0;
            do {
              (*(x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x24])
                        (x,(long)(*(int *)&(this->super_TPZMatrix<std::complex<double>_>).
                                           super_TPZBaseMatrix.field_0x1c * (int)uVar16 + iVar15),
                         uVar9);
              if ((local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow <=
                   (long)uVar16) ||
                 (local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <=
                  (long)uVar9)) {
                TPZFMatrix<std::complex<double>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              *(ulong *)local_150.fElem
                        [local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow *
                         uVar9 + uVar16]._M_value = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
              *(undefined8 *)
               ((long)local_150.fElem
                      [local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow *
                       uVar9 + uVar16]._M_value + 8) = in_XMM3_Qa;
              uVar9 = uVar9 + 1;
              in_XMM2_Qa = in_XMM3_Qa;
            } while (uVar12 != uVar9);
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar3);
      }
      alpha_01._M_value._4_4_ = 0;
      alpha_01._M_value._0_4_ = alpha_00._M_value._0_4_;
      beta_00._M_value._8_8_ = in_XMM2_Qa;
      beta_00._M_value._0_8_ = in_stack_fffffffffffffde8;
      alpha_01._M_value._8_8_ = uVar14;
      in_XMM3_Qa = in_XMM1_Qa;
      MultAddScalar(this,&local_150,&local_c0,&local_c0,alpha_01,beta_00,in_stack_fffffffffffffdf8);
      if (0 < iVar10) {
        uVar16 = 0;
        do {
          if (0 < iVar11) {
            uVar9 = 0;
            do {
              uVar13 = *(undefined8 *)
                        ((long)local_c0.fElem
                               [local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.
                                fRow * uVar9 + uVar16]._M_value + 8);
              iVar2 = *(int *)&(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                               field_0x1c * (int)uVar16 + iVar15;
              if (((iVar2 < 0) ||
                  ((z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <=
                   (long)iVar2)) ||
                 ((z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                  (long)uVar9)) {
                TPZFMatrix<std::complex<double>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar1 = (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
              pcVar4 = z->fElem;
              *(undefined8 *)pcVar4[lVar1 * uVar9 + (long)iVar2]._M_value =
                   *(undefined8 *)
                    local_c0.fElem
                    [local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow *
                     uVar9 + uVar16]._M_value;
              *(undefined8 *)(pcVar4[lVar1 * uVar9 + (long)iVar2]._M_value + 8) = uVar13;
              uVar9 = uVar9 + 1;
            } while (uVar12 != uVar9);
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar3);
      }
      TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_c0);
      TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_150);
      iVar15 = iVar15 + 1;
    } while (iVar15 < *(int *)&(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                               field_0x1c);
  }
  return;
}

Assistant:

void TPZTransfer<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
                                      TVar alpha, TVar beta, int opt) const{
    // multiplies the transfer matrix and puts the result in z
    if ((!opt && this->Cols() != x.Rows()) || (opt && this->Rows() != x.Rows()))
        this->Error( "TPZTransfer<TVar>::MultAdd <matrices with incompatible dimensions>" );
    if(x.Cols() != y.Cols() || x.Cols() != z.Cols()) {
        this->Error ("TPZTransfer<TVar>::MultiplyAdd incompatible dimensions\n");
    }
    int rows = fRowBlock.MaxBlockSize();
    int xcols = x.Cols();
    int ic, c, r;
    this->PrepareZ(y,z,beta,opt);
    if (fNTVarVar == 1) {
        MultAddScalar(x, y, z, alpha, beta, opt);
    }
    else
    {
        int nrc = x.Rows();
        int ncc = x.Cols();
        int thisr = this->Rows()/fNTVarVar;
        int thisc = this->Cols()/fNTVarVar;
        for(int iv=0; iv<fNTVarVar; iv++) {
            TPZFMatrix<TVar> tempcoarse(thisc,ncc), tempfine(thisr,ncc);
            for (int i=0; i<thisr; i++) {
                for (int c=0; c<ncc; c++) {
                    tempcoarse(i,c) = x.GetVal(iv+i*fNTVarVar,c);
                }
            }
            MultAddScalar(tempcoarse, tempfine, tempfine, alpha, 0., opt);
            for (int i=0; i<thisr; i++) {
                for (int c=0; c<ncc; c++) {
                    z(iv+i*fNTVarVar,c) = tempfine.GetVal(i,c);
                }
            }
        }
    }
}